

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O0

char * lua_setupvalue(lua_State *L,int funcindex,int n)

{
  StkId pTVar1;
  undefined1 uVar2;
  undefined2 uVar3;
  TValue *fi_00;
  TValue *io1;
  TValue *io2;
  StkId fi;
  GCObject *owner;
  TValue *val;
  char *name;
  int n_local;
  int funcindex_local;
  lua_State *L_local;
  
  owner = (GCObject *)0x0;
  fi = (StkId)0x0;
  name._0_4_ = n;
  name._4_4_ = funcindex;
  _n_local = L;
  fi_00 = index2addr(L,funcindex);
  val = (TValue *)aux_upvalue(fi_00,(int)name,(TValue **)&owner,(GCObject **)&fi);
  if (val != (TValue *)0x0) {
    _n_local->top = _n_local->top + -1;
    pTVar1 = _n_local->top;
    (owner->gch).next = (GCObject *)pTVar1->value_;
    uVar2 = *(undefined1 *)((long)&pTVar1->tt_ + 1);
    uVar3 = *(undefined2 *)((long)&pTVar1->tt_ + 2);
    (owner->gch).tt = *(undefined1 *)&pTVar1->tt_;
    (owner->gch).marked = uVar2;
    *(undefined2 *)&(owner->h).flags = uVar3;
    if ((((_n_local->top->tt_ & 0x40U) != 0) && (((byte)(_n_local->top->value_).f[9] & 3) != 0)) &&
       ((fi->tt_ & 0x400) != 0)) {
      luaC_barrier_(_n_local,(GCObject *)fi,(_n_local->top->value_).gc);
    }
  }
  return (char *)val;
}

Assistant:

LUA_API const char *lua_setupvalue (lua_State *L, int funcindex, int n) {
  const char *name;
  TValue *val = NULL;  /* to avoid warnings */
  GCObject *owner = NULL;  /* to avoid warnings */
  StkId fi;
  lua_lock(L);
  fi = index2addr(L, funcindex);
  api_checknelems(L, 1);
  name = aux_upvalue(fi, n, &val, &owner);
  if (name) {
    L->top--;
    setobj(L, val, L->top);
    luaC_barrier(L, owner, L->top);
  }
  lua_unlock(L);
  return name;
}